

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O2

void __thiscall
ConsoleListener::person_changed(ConsoleListener *this,Person *param_1,string *property,any *value)

{
  bool bVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Person\'s ");
  poVar2 = std::operator<<(poVar2,(string *)property);
  std::operator<<(poVar2," has been changed to ");
  bVar1 = std::operator==(property,"age");
  if (bVar1) {
    std::any_cast<unsigned_long>(value);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void person_changed(Person&, const std::string& property, const std::any& value) override
	{
		std::cout << "Person's " << property << " has been changed to ";
		if(property == "age")
		{
			std::cout << std::any_cast<size_t>(value);
		}

		std::cout << std::endl;
	}